

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_constraint.cpp
# Opt level: O1

unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> __thiscall
duckdb::Transformer::TransformConstraint
          (Transformer *this,PGConstraint *constraint,ColumnDefinition *column,idx_t index)

{
  pointer pcVar1;
  bool bVar2;
  CompressionType compression_type;
  Transformer *pTVar3;
  CompressionType *pCVar4;
  optional_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  override_fk_column;
  InvalidInputException *pIVar5;
  string *psVar6;
  ParserException *this_00;
  NotImplementedException *this_01;
  LogicalIndex in_R8;
  undefined1 local_a0 [16];
  undefined1 local_90 [24];
  ParserOptions *local_78;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  
  switch(*(undefined4 *)((long)&(column->name)._M_dataplus._M_p + 4)) {
  case 1:
    pTVar3 = (Transformer *)operator_new(0x18);
    NotNullConstraint::NotNullConstraint((NotNullConstraint *)pTVar3,in_R8);
    (this->parent).ptr = pTVar3;
    break;
  case 2:
    TransformExpression((Transformer *)(local_90 + 0x10),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)constraint);
    ColumnDefinition::SetDefaultValue
              ((ColumnDefinition *)index,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_90 + 0x10));
    if ((Transformer *)local_90._16_8_ != (Transformer *)0x0) {
      (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_90._16_8_)->ptr->options)();
    }
    local_a0._0_8_ = (Transformer *)0x0;
    goto LAB_017a5961;
  default:
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_a0._0_8_ = local_a0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a0,"Constraint not implemented!","");
    NotImplementedException::NotImplementedException(this_01,(string *)local_a0);
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case 4:
    TransformConstraint(this,constraint);
    break;
  case 5:
    ColumnDefinition::GetName_abi_cxx11_((string *)local_70,(ColumnDefinition *)index);
    pTVar3 = (Transformer *)operator_new(0x38);
    local_a0._0_8_ = local_a0 + 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._0_8_ == &local_60) {
      local_90._8_8_ = local_60._8_8_;
    }
    else {
      local_a0._0_8_ = local_70._0_8_;
    }
    local_a0._8_8_ = local_70._8_8_;
    local_70._8_8_ = (__buckets_ptr)0x0;
    local_60._M_local_buf[0] = '\0';
    local_70._0_8_ = &local_60;
    UniqueConstraint::UniqueConstraint((UniqueConstraint *)pTVar3,in_R8,(string *)local_a0,true);
    goto LAB_017a59de;
  case 6:
    ColumnDefinition::GetName_abi_cxx11_((string *)local_70,(ColumnDefinition *)index);
    pTVar3 = (Transformer *)operator_new(0x38);
    local_a0._0_8_ = local_a0 + 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._0_8_ == &local_60) {
      local_90._8_8_ = local_60._8_8_;
    }
    else {
      local_a0._0_8_ = local_70._0_8_;
    }
    local_a0._8_8_ = local_70._8_8_;
    local_70._8_8_ = (__buckets_ptr)0x0;
    local_60._M_local_buf[0] = '\0';
    local_70._0_8_ = &local_60;
    UniqueConstraint::UniqueConstraint((UniqueConstraint *)pTVar3,in_R8,(string *)local_a0,false);
LAB_017a59de:
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_);
    }
    (this->parent).ptr = pTVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._0_8_ != &local_60) {
      operator_delete((void *)local_70._0_8_);
    }
    break;
  case 8:
    override_fk_column.ptr = ColumnDefinition::Name_abi_cxx11_((ColumnDefinition *)index);
    TransformForeignKeyConstraint((duckdb *)local_a0,(PGConstraint *)column,override_fk_column);
    goto LAB_017a5961;
  case 0xd:
    ::std::__cxx11::string::string
              ((string *)local_a0,(char *)(column->tags)._M_h._M_buckets,(allocator *)local_70);
    compression_type = CompressionTypeFromString((string *)local_a0);
    ColumnDefinition::SetCompressionType((ColumnDefinition *)index,compression_type);
    if ((Transformer *)local_a0._0_8_ != (Transformer *)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_);
    }
    pCVar4 = ColumnDefinition::CompressionType((ColumnDefinition *)index);
    if (*pCVar4 == COMPRESSION_AUTO) {
      this_00 = (ParserException *)__cxa_allocate_exception(0x10);
      local_a0._0_8_ = (Transformer *)(local_a0 + 0x10);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,
                 "Unrecognized option for column compression, expected none, uncompressed, rle, dictionary, pfor, bitpacking or fsst"
                 ,"");
      ParserException::ParserException(this_00,(string *)local_a0);
      __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
  case 0:
    (this->parent).ptr = (Transformer *)0x0;
    break;
  case 0xe:
    bVar2 = ColumnDefinition::HasDefaultValue((ColumnDefinition *)index);
    if (bVar2) {
      pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_a0._0_8_ = local_a0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,
                 "\"%s\" has a DEFAULT value set, it can not become a GENERATED column","");
      psVar6 = ColumnDefinition::Name_abi_cxx11_((ColumnDefinition *)index);
      local_50._M_p = &stack0xffffffffffffffc0;
      pcVar1 = (psVar6->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + psVar6->_M_string_length);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar5,(string *)local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
      __cxa_throw(pIVar5,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    TransformExpression((Transformer *)&local_78,
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)constraint);
    ColumnDefinition::SetGeneratedExpression
              ((ColumnDefinition *)index,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_78);
    if (local_78 != (ParserOptions *)0x0) {
      (**(code **)(*(long *)&local_78->preserve_identifier_case + 8))();
    }
    local_a0._0_8_ = (Transformer *)0x0;
LAB_017a5961:
    (this->parent).ptr = (Transformer *)local_a0._0_8_;
    break;
  case 0xf:
    pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_a0._0_8_ = local_a0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a0,"Can not create a STORED generated column!","");
    InvalidInputException::InvalidInputException(pIVar5,(string *)local_a0);
    __cxa_throw(pIVar5,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
         (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)this;
}

Assistant:

unique_ptr<Constraint> Transformer::TransformConstraint(duckdb_libpgquery::PGConstraint &constraint,
                                                        ColumnDefinition &column, idx_t index) {
	switch (constraint.contype) {
	case duckdb_libpgquery::PG_CONSTR_NOTNULL:
		return make_uniq<NotNullConstraint>(LogicalIndex(index));
	case duckdb_libpgquery::PG_CONSTR_CHECK:
		return TransformConstraint(constraint);
	case duckdb_libpgquery::PG_CONSTR_PRIMARY:
		return make_uniq<UniqueConstraint>(LogicalIndex(index), column.GetName(), true);
	case duckdb_libpgquery::PG_CONSTR_UNIQUE:
		return make_uniq<UniqueConstraint>(LogicalIndex(index), column.GetName(), false);
	case duckdb_libpgquery::PG_CONSTR_NULL:
		return nullptr;
	case duckdb_libpgquery::PG_CONSTR_GENERATED_VIRTUAL: {
		if (column.HasDefaultValue()) {
			throw InvalidInputException("\"%s\" has a DEFAULT value set, it can not become a GENERATED column",
			                            column.Name());
		}
		column.SetGeneratedExpression(TransformExpression(constraint.raw_expr));
		return nullptr;
	}
	case duckdb_libpgquery::PG_CONSTR_GENERATED_STORED:
		throw InvalidInputException("Can not create a STORED generated column!");
	case duckdb_libpgquery::PG_CONSTR_DEFAULT:
		column.SetDefaultValue(TransformExpression(constraint.raw_expr));
		return nullptr;
	case duckdb_libpgquery::PG_CONSTR_COMPRESSION:
		column.SetCompressionType(CompressionTypeFromString(constraint.compression_name));
		if (column.CompressionType() == CompressionType::COMPRESSION_AUTO) {
			throw ParserException("Unrecognized option for column compression, expected none, uncompressed, rle, "
			                      "dictionary, pfor, bitpacking or fsst");
		}
		return nullptr;
	case duckdb_libpgquery::PG_CONSTR_FOREIGN:
		return TransformForeignKeyConstraint(constraint, &column.Name());
	default:
		throw NotImplementedException("Constraint not implemented!");
	}
}